

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sha256.cpp
# Opt level: O0

void Sha256::Private::WriteByteBlock(Sha256 *p)

{
  uint local_5c;
  UInt32 local_58;
  uint i;
  UInt32 data32 [16];
  Sha256 *p_local;
  
  for (local_5c = 0; local_5c < 0x10; local_5c = local_5c + 1) {
    (&local_58)[local_5c] =
         (uint)p->buffer[local_5c << 2] * 0x1000000 + (uint)p->buffer[local_5c * 4 + 1] * 0x10000 +
         (uint)p->buffer[local_5c * 4 + 2] * 0x100 + (uint)p->buffer[local_5c * 4 + 3];
  }
  Transform(p->state,&local_58);
  return;
}

Assistant:

static void WriteByteBlock(Sha256* p)
  {
    UInt32 data32[16];
    unsigned i;
    for (i = 0; i < 16; i++)
      data32[i] =
        ((UInt32)(p->buffer[i * 4    ]) << 24) +
        ((UInt32)(p->buffer[i * 4 + 1]) << 16) +
        ((UInt32)(p->buffer[i * 4 + 2]) <<  8) +
        ((UInt32)(p->buffer[i * 4 + 3]));
    Transform(p->state, data32);
  }